

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O0

void __thiscall
Imath_3_2::Euler<float>::Euler(Euler<float> *this,float xi,float yi,float zi,Order p,InputLayout l)

{
  int in_EDX;
  undefined4 in_ESI;
  Vec3<float> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  
  Vec3<float>::Vec3(in_RDI);
  setOrder((Euler<float> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
           (Order)in_stack_ffffffffffffffdc);
  if (in_EDX == 0) {
    Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffffd8,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da);
    setXYZVector((Euler<float> *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
                 (Vec3<float> *)CONCAT44(in_XMM2_Da,in_ESI));
  }
  else {
    in_RDI->x = in_XMM0_Da;
    in_RDI->y = in_XMM1_Da;
    in_RDI->z = in_XMM2_Da;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Euler<T>::Euler (
    T                              xi,
    T                              yi,
    T                              zi,
    typename Euler<T>::Order       p,
    typename Euler<T>::InputLayout l) IMATH_NOEXCEPT
{
    setOrder (p);
    if (l == XYZLayout)
        setXYZVector (Vec3<T> (xi, yi, zi));
    else
    {
        x = xi;
        y = yi;
        z = zi;
    }
}